

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
RegisterDepfileParserTestBasic::RegisterDepfileParserTestBasic(RegisterDepfileParserTestBasic *this)

{
  RegisterDepfileParserTestBasic *this_local;
  
  RegisterTest(DepfileParserTestBasic::Create,"DepfileParserTest.Basic");
  return;
}

Assistant:

TEST_F(DepfileParserTest, Basic) {
  string err;
  EXPECT_TRUE(Parse(
"build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("build/ninja.o", parser_.outs_[0].AsString());
  EXPECT_EQ(4u, parser_.ins_.size());
}